

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  U32 UVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  if (litLength == 0) {
    return 0;
  }
  if (optPtr->priceType == zop_predef) {
    UVar1 = litLength * 0x600;
  }
  else {
    UVar1 = litLength * optPtr->litSumBasePrice;
    uVar2 = 0;
    do {
      uVar3 = optPtr->litFreq[literals[uVar2]] + 1;
      iVar4 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      if (optLevel == 0) {
        iVar4 = iVar4 << 8;
      }
      else {
        iVar4 = (uVar3 * 0x100 >> ((byte)iVar4 & 0x1f)) + iVar4 * 0x100;
      }
      UVar1 = UVar1 - iVar4;
      uVar2 = uVar2 + 1;
    } while (litLength != uVar2);
  }
  return UVar1;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;
    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}